

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseEditBackspace(linenoiseState *l)

{
  int iVar1;
  int chlen;
  linenoiseState *l_local;
  
  if ((l->pos != 0) && (l->len != 0)) {
    iVar1 = (*(code *)prevCharLen)(l->buf,l->len,l->pos,0);
    memmove(l->buf + (l->pos - (long)iVar1),l->buf + l->pos,l->len - l->pos);
    l->pos = l->pos - (long)iVar1;
    l->len = l->len - (long)iVar1;
    l->buf[l->len] = '\0';
    refreshLine(l);
  }
  return;
}

Assistant:

void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        int chlen = prevCharLen(l->buf,l->len,l->pos,NULL);
        memmove(l->buf+l->pos-chlen,l->buf+l->pos,l->len-l->pos);
        l->pos-=chlen;
        l->len-=chlen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}